

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O1

bool __thiscall re2::Compiler::ByteRangeEqual(Compiler *this,int id1,int id2)

{
  Inst *pIVar1;
  bool bVar2;
  
  pIVar1 = this->inst_;
  if (((pIVar1[id1].out_opcode_ & 7) == 2) && ((pIVar1[id2].out_opcode_ & 7) == 2)) {
    if ((pIVar1[id1].field_1.field_3.lo_ == pIVar1[id2].field_1.field_3.lo_) &&
       (pIVar1[id1].field_1.field_3.hi_ == pIVar1[id2].field_1.field_3.hi_)) {
      bVar2 = pIVar1[id1].field_1.field_3.foldcase_ == pIVar1[id2].field_1.field_3.foldcase_;
    }
    else {
      bVar2 = false;
    }
    return bVar2;
  }
  __assert_fail("(opcode()) == (kInstByteRange)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/prog.h",0x6f,
                "int re2::Prog::Inst::lo()");
}

Assistant:

bool Compiler::ByteRangeEqual(int id1, int id2) {
  return inst_[id1].lo() == inst_[id2].lo() &&
         inst_[id1].hi() == inst_[id2].hi() &&
         inst_[id1].foldcase() == inst_[id2].foldcase();
}